

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

void mriStep_Free(ARKodeMem ark_mem)

{
  N_Vector in_RDX;
  N_Vector extraout_RDX;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  int unaff_retaddr;
  ARKodeMRIStepMem step_mem;
  sunindextype Clrw;
  sunindextype Cliw;
  N_Vector *in_stack_ffffffffffffffd8;
  ARKodeMem ark_mem_00;
  N_Vector in_stack_ffffffffffffffe8;
  void *in_stack_fffffffffffffff0;
  
  if ((in_RDI != (ARKodeMem)0x0) && (in_RDI->step_mem != (void *)0x0)) {
    ark_mem_00 = (ARKodeMem)in_RDI->step_mem;
    if (ark_mem_00->VRabstol != (N_Vector)0x0) {
      in_RSI = (N_Vector)&stack0xfffffffffffffff0;
      MRIStepCoupling_Space
                ((MRIStepCoupling)ark_mem_00->VRabstol,(sunindextype *)in_RSI,
                 (sunindextype *)&stack0xffffffffffffffe8);
      in_RDX = in_stack_ffffffffffffffe8;
      MRIStepCoupling_Free((MRIStepCoupling)ark_mem_00);
      ark_mem_00->VRabstol = (N_Vector)0x0;
      in_RDI->liw = in_RDI->liw - (long)in_stack_fffffffffffffff0;
      in_RDI->lrw = in_RDI->lrw - (long)in_RDX;
      in_stack_ffffffffffffffe8 = in_RDX;
      if (ark_mem_00->rfun != (ARKRwtFn)0x0) {
        free(ark_mem_00->rfun);
        ark_mem_00->rfun = (ARKRwtFn)0x0;
        in_RDX = (N_Vector)(long)(*(int *)&ark_mem_00->efun + 1);
        in_RDI->liw = in_RDI->liw - (long)in_RDX;
      }
      if (*(long *)&ark_mem_00->user_rfun != 0) {
        free(*(void **)&ark_mem_00->user_rfun);
        *(undefined8 *)&ark_mem_00->user_rfun = 0;
        in_RDX = (N_Vector)(long)*(int *)&ark_mem_00->efun;
        in_RDI->liw = in_RDI->liw - (long)in_RDX;
      }
      if (ark_mem_00->r_data != (void *)0x0) {
        free(ark_mem_00->r_data);
        ark_mem_00->r_data = (void *)0x0;
        in_RDX = (N_Vector)(long)*(int *)&ark_mem_00->efun;
        in_RDI->lrw = in_RDI->lrw - (long)in_RDX;
      }
      if (*(long *)&ark_mem_00->constraintsSet != 0) {
        free(*(void **)&ark_mem_00->constraintsSet);
        *(undefined8 *)&ark_mem_00->constraintsSet = 0;
        in_RDX = (N_Vector)(long)*(int *)&ark_mem_00->efun;
        in_RDI->lrw = in_RDI->lrw - (long)in_RDX;
      }
    }
    if ((ark_mem_00->step_setuserdata != (ARKTimetepSetUserDataFn)0x0) &&
       (*(int *)&ark_mem_00->step_printallstats != 0)) {
      SUNNonlinSolFree(ark_mem_00->step_setuserdata);
      *(undefined4 *)&ark_mem_00->step_printallstats = 0;
      in_RDX = extraout_RDX;
    }
    ark_mem_00->step_setuserdata = (ARKTimetepSetUserDataFn)0x0;
    if (ark_mem_00->step_computestate != (ARKTimestepComputeState)0x0) {
      (*ark_mem_00->step_computestate)(in_RDI,in_RSI,in_RDX);
      ark_mem_00->step_setnonlinearsolver = (ARKTimestepSetNonlinearSolver)0x0;
    }
    if (ark_mem_00->step_mem != (void *)0x0) {
      arkFreeVec(ark_mem_00,in_stack_ffffffffffffffd8);
      ark_mem_00->step_mem = (void *)0x0;
    }
    if (ark_mem_00->step_init != (ARKTimestepInitFn)0x0) {
      arkFreeVec(ark_mem_00,in_stack_ffffffffffffffd8);
      ark_mem_00->step_init = (ARKTimestepInitFn)0x0;
    }
    if (ark_mem_00->step_fullrhs != (ARKTimestepFullRHSFn)0x0) {
      arkFreeVec(ark_mem_00,in_stack_ffffffffffffffd8);
      ark_mem_00->step_fullrhs = (ARKTimestepFullRHSFn)0x0;
    }
    if ((ark_mem_00->Sabstol != 0.0) &&
       (arkFreeVecArray(unaff_retaddr,(N_Vector **)in_RDI,(sunindextype)in_stack_fffffffffffffff0,
                        (long *)in_stack_ffffffffffffffe8,(sunindextype)ark_mem_00,
                        (long *)in_stack_ffffffffffffffd8), ark_mem_00->atolmin0 != 0)) {
      ark_mem_00->Vabstol = (N_Vector)0x0;
    }
    if (ark_mem_00->Vabstol != (N_Vector)0x0) {
      arkFreeVecArray(unaff_retaddr,(N_Vector **)in_RDI,(sunindextype)in_stack_fffffffffffffff0,
                      (long *)in_stack_ffffffffffffffe8,(sunindextype)ark_mem_00,
                      (long *)in_stack_ffffffffffffffd8);
    }
    if (ark_mem_00->step_getnonlinsolvstats != (ARKTimestepGetNonlinSolvStats)0x0) {
      free(ark_mem_00->step_getnonlinsolvstats);
      ark_mem_00->step_getnonlinsolvstats = (ARKTimestepGetNonlinSolvStats)0x0;
      in_RDI->lrw = in_RDI->lrw - (long)*(int *)&ark_mem_00->step_setstagepredictfn;
    }
    if (*(long *)&ark_mem_00->step_supports_massmatrix != 0) {
      free(*(void **)&ark_mem_00->step_supports_massmatrix);
      *(undefined8 *)&ark_mem_00->step_supports_massmatrix = 0;
      in_RDI->liw = in_RDI->liw - (long)*(int *)&ark_mem_00->step_setstagepredictfn;
    }
    *(undefined4 *)&ark_mem_00->step_setstagepredictfn = 0;
    free(in_RDI->step_mem);
    in_RDI->step_mem = (void *)0x0;
  }
  return;
}

Assistant:

void mriStep_Free(ARKodeMem ark_mem)
{
  sunindextype Cliw, Clrw;
  ARKodeMRIStepMem step_mem;

  /* nothing to do if ark_mem is already NULL */
  if (ark_mem == NULL) { return; }

  /* conditional frees on non-NULL MRIStep module */
  if (ark_mem->step_mem != NULL)
  {
    step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;

    /* free the coupling structure and derived quantities */
    if (step_mem->MRIC != NULL)
    {
      MRIStepCoupling_Space(step_mem->MRIC, &Cliw, &Clrw);
      MRIStepCoupling_Free(step_mem->MRIC);
      step_mem->MRIC = NULL;
      ark_mem->liw -= Cliw;
      ark_mem->lrw -= Clrw;
      if (step_mem->stagetypes)
      {
        free(step_mem->stagetypes);
        step_mem->stagetypes = NULL;
        ark_mem->liw -= (step_mem->stages + 1);
      }
      if (step_mem->stage_map)
      {
        free(step_mem->stage_map);
        step_mem->stage_map = NULL;
        ark_mem->liw -= step_mem->stages;
      }
      if (step_mem->Ae_row)
      {
        free(step_mem->Ae_row);
        step_mem->Ae_row = NULL;
        ark_mem->lrw -= step_mem->stages;
      }
      if (step_mem->Ai_row)
      {
        free(step_mem->Ai_row);
        step_mem->Ai_row = NULL;
        ark_mem->lrw -= step_mem->stages;
      }
    }

    /* free the nonlinear solver memory (if applicable) */
    if ((step_mem->NLS != NULL) && (step_mem->ownNLS))
    {
      SUNNonlinSolFree(step_mem->NLS);
      step_mem->ownNLS = SUNFALSE;
    }
    step_mem->NLS = NULL;

    /* free the linear solver memory */
    if (step_mem->lfree != NULL)
    {
      step_mem->lfree((void*)ark_mem);
      step_mem->lmem = NULL;
    }

    /* free the sdata, zpred and zcor vectors */
    if (step_mem->sdata != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->sdata);
      step_mem->sdata = NULL;
    }
    if (step_mem->zpred != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->zpred);
      step_mem->zpred = NULL;
    }
    if (step_mem->zcor != NULL)
    {
      arkFreeVec(ark_mem, &step_mem->zcor);
      step_mem->zcor = NULL;
    }

    /* free the RHS vectors */
    if (step_mem->Fse)
    {
      arkFreeVecArray(step_mem->nstages_allocated, &(step_mem->Fse),
                      ark_mem->lrw1, &(ark_mem->lrw), ark_mem->liw1,
                      &(ark_mem->liw));
      if (step_mem->unify_Fs) { step_mem->Fsi = NULL; }
    }

    if (step_mem->Fsi)
    {
      arkFreeVecArray(step_mem->nstages_allocated, &(step_mem->Fsi),
                      ark_mem->lrw1, &(ark_mem->lrw), ark_mem->liw1,
                      &(ark_mem->liw));
    }

    /* free the reusable arrays for fused vector interface */
    if (step_mem->cvals != NULL)
    {
      free(step_mem->cvals);
      step_mem->cvals = NULL;
      ark_mem->lrw -= (step_mem->nfusedopvecs);
    }
    if (step_mem->Xvecs != NULL)
    {
      free(step_mem->Xvecs);
      step_mem->Xvecs = NULL;
      ark_mem->liw -= (step_mem->nfusedopvecs);
    }
    step_mem->nfusedopvecs = 0;

    /* free the time stepper module itself */
    free(ark_mem->step_mem);
    ark_mem->step_mem = NULL;
  }
}